

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _tree.hpp
# Opt level: O1

void __thiscall
ft::
RBTree<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
::treeInit(RBTree<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
           *this)

{
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *ptVar1;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *ptVar2;
  undefined1 local_58 [16];
  second_type local_48;
  Colour local_40;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *local_38;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *ptStack_30;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *local_28;
  
  ptVar2 = (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
            *)operator_new(0x48);
  this->NIL = ptVar2;
  ptVar2 = (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
            *)operator_new(0x48);
  this->m_first = ptVar2;
  ptVar2 = (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
            *)operator_new(0x48);
  this->m_last = ptVar2;
  ptVar2 = this->NIL;
  local_58[0] = 0;
  local_48 = 0;
  local_40 = BLACK;
  local_38 = (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
              *)0x0;
  ptStack_30 = (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                *)0x0;
  local_28 = (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
              *)0x0;
  (ptVar2->value).first._M_dataplus._M_p = (pointer)&(ptVar2->value).first.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)ptVar2,local_58);
  (ptVar2->value).second = local_48;
  ptVar2->colour = local_40;
  ptVar2->left = local_38;
  ptVar2->right = ptStack_30;
  ptVar2->parent = local_28;
  ptVar2 = this->m_first;
  local_58[0] = 0;
  local_48 = 0;
  local_40 = BLACK;
  local_38 = (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
              *)0x0;
  ptStack_30 = (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                *)0x0;
  local_28 = (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
              *)0x0;
  (ptVar2->value).first._M_dataplus._M_p = (pointer)&(ptVar2->value).first.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)ptVar2,local_58);
  (ptVar2->value).second = local_48;
  ptVar2->colour = local_40;
  ptVar2->left = local_38;
  ptVar2->right = ptStack_30;
  ptVar2->parent = local_28;
  ptVar2 = this->m_last;
  local_58[0] = 0;
  local_48 = 0;
  local_40 = BLACK;
  local_38 = (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
              *)0x0;
  ptStack_30 = (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                *)0x0;
  local_28 = (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
              *)0x0;
  (ptVar2->value).first._M_dataplus._M_p = (pointer)&(ptVar2->value).first.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)ptVar2,local_58);
  (ptVar2->value).second = local_48;
  ptVar2->colour = local_40;
  ptVar2->left = local_38;
  ptVar2->right = ptStack_30;
  ptVar2->parent = local_28;
  ptVar2 = this->NIL;
  ptVar2->parent = ptVar2;
  ptVar2->left = ptVar2;
  ptVar2->right = ptVar2;
  ptVar1 = this->m_first;
  ptVar1->left = ptVar2;
  ptVar1->right = ptVar2;
  ptVar1 = this->m_last;
  ptVar1->left = ptVar2;
  ptVar1->right = ptVar2;
  this->m_root = ptVar2;
  return;
}

Assistant:

void treeInit() {
		this->NIL = this->m_alloc.allocate(1);
		this->m_first = this->m_alloc.allocate(1);
		this->m_last = this->m_alloc.allocate(1);

		this->m_alloc.construct(this->NIL, BLACK);
		this->m_alloc.construct(this->m_first, BLACK);
		this->m_alloc.construct(this->m_last, BLACK);

		this->NIL->parent = this->NIL;
		this->NIL->left = this->NIL;
		this->NIL->right = this->NIL;
		this->m_first->left = this->NIL;
		this->m_first->right = this->NIL;
		this->m_last->left = this->NIL;
		this->m_last->right = this->NIL;

		this->m_root = this->NIL;
	}